

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

uintmax_t ghc::filesystem::hard_link_count(path *p,error_code *ec)

{
  bool bVar1;
  file_type fVar2;
  error_code eVar3;
  file_status local_40;
  undefined4 uStack_34;
  undefined1 local_28 [8];
  file_status fs;
  uintmax_t result;
  error_code *ec_local;
  path *p_local;
  
  std::error_code::clear(ec);
  fs._type = none;
  fs._perms = none;
  fs._6_2_ = 0;
  detail::status_ex((path *)local_28,(error_code *)p,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)&fs,0);
  fVar2 = file_status::type((file_status *)local_28);
  if (fVar2 == not_found) {
    eVar3 = detail::make_error_code(not_found);
    *(ulong *)ec = CONCAT44(uStack_34,eVar3._M_value);
    ec->_M_cat = eVar3._M_cat;
  }
  bVar1 = std::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    local_40._type = ~none;
    local_40._perms = unknown;
    local_40._6_2_ = 0xffff;
  }
  else {
    local_40 = fs;
  }
  file_status::~file_status((file_status *)local_28);
  return (uintmax_t)local_40;
}

Assistant:

GHC_INLINE uintmax_t hard_link_count(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    uintmax_t result = static_cast<uintmax_t>(-1);
    std::shared_ptr<void> file(::CreateFileW(GHC_NATIVEWP(p), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0), CloseHandle);
    BY_HANDLE_FILE_INFORMATION inf;
    if (file.get() == INVALID_HANDLE_VALUE) {
        ec = detail::make_system_error();
    }
    else {
        if (!::GetFileInformationByHandle(file.get(), &inf)) {
            ec = detail::make_system_error();
        }
        else {
            result = inf.nNumberOfLinks;
        }
    }
    return result;
#else
    uintmax_t result = 0;
    file_status fs = detail::status_ex(p, ec, nullptr, nullptr, &result, nullptr);
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
    }
    return ec ? static_cast<uintmax_t>(-1) : result;
#endif
}